

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mix.cpp
# Opt level: O1

bool __thiscall Timidity::GF1Envelope::Recompute(GF1Envelope *this,Voice *v)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  byte bVar4;
  byte in_CL;
  ulong uVar5;
  
  bVar4 = 0;
  do {
    bVar1 = (this->super_MinEnvelope).stage;
    uVar5 = (ulong)bVar1;
    if (5 < uVar5) {
      this->increment = 0;
      (this->super_MinEnvelope).bUpdating = '\0';
      v->status = v->status & 0xe9 | 4;
LAB_0032887c:
      return (bool)(bVar4 & in_CL);
    }
    if (((bVar1 == 3) && ((v->status & 4) == 0)) && ((v->sample->modes & 0x20) != 0)) {
      v->status = v->status | 2;
      this->increment = 0;
      (this->super_MinEnvelope).bUpdating = '\0';
      goto LAB_0032887c;
    }
    (this->super_MinEnvelope).stage = bVar1 + 1;
    iVar2 = this->offset[uVar5];
    if (this->volume != iVar2) {
      this->target = iVar2;
      iVar3 = this->rate[uVar5];
      this->increment = iVar3;
      if (iVar2 < this->volume) {
        this->increment = -iVar3;
      }
      goto LAB_0032887c;
    }
    in_CL = in_CL & bVar4;
    bVar4 = 1;
  } while( true );
}

Assistant:

bool GF1Envelope::Recompute(Voice *v)
{
	int newstage;

	newstage = stage;

	if (newstage > GF1_RELEASEC)
	{
		/* Envelope ran out. */
		increment = 0;
		bUpdating = false;
		v->status &= ~(VOICE_SUSTAINING | VOICE_LPE);
		v->status |= VOICE_RELEASING;
		/* play sampled release */
		return 0;
	}

	if (newstage == GF1_RELEASE && !(v->status & VOICE_RELEASING) && (v->sample->modes & PATCH_SUSTAIN))
	{
		v->status |= VOICE_SUSTAINING;
		/* Freeze envelope until note turns off. Trumpets want this. */
		increment = 0;
		bUpdating = false;
	}
	else
	{
		stage = newstage + 1;

		if (volume == offset[newstage])
		{
			return Recompute(v);
		}
		target = offset[newstage];
		increment = rate[newstage];
		if (target < volume)
			increment = -increment;
	}

	return 0;
}